

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramUniformTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ProgramUniformTests::init(ProgramUniformTests *this,EVP_PKEY_CTX *ctx)

{
  DataType DVar1;
  AssignMethod assignMethod;
  _Alloc_hider _Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DataType DVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int extraout_EAX;
  long lVar10;
  DataType *pDVar11;
  char *pcVar12;
  UniformCollection *pUVar13;
  char *pcVar14;
  UniformCollection *pUVar15;
  TestCaseGroup *pTVar16;
  TestCaseGroup *pTVar17;
  TestCaseGroup *this_00;
  UniformAssignCase *pUVar18;
  ulong uVar19;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *nameSuffix;
  long lVar20;
  uint uVar21;
  long lVar22;
  uint uVar23;
  undefined8 *puVar24;
  pointer pUVar25;
  CheckMethod checkMethod;
  uint uVar26;
  deUint32 in_stack_fffffffffffffca8;
  int local_350;
  string name;
  string collectionGroupName;
  string nameWithBoolType;
  string name_1;
  string nameWithMatrixType;
  UniformCollectionGroup defaultUniformCollections [9];
  
  lVar10 = 0x1f8;
  nameSuffix = &defaultUniformCollections[0].name.field_2;
  do {
    (((string *)(nameSuffix + -1))->_M_dataplus)._M_p = (pointer)nameSuffix;
    *(size_type *)((long)nameSuffix + -8) = 0;
    nameSuffix->_M_local_buf[0] = '\0';
    pcVar12 = (char *)(nameSuffix + 2);
    pcVar12[0] = '\0';
    pcVar12[1] = '\0';
    pcVar12[2] = '\0';
    pcVar12[3] = '\0';
    pcVar12[4] = '\0';
    pcVar12[5] = '\0';
    pcVar12[6] = '\0';
    pcVar12[7] = '\0';
    pcVar12 = (char *)(nameSuffix + 1);
    pcVar12[0] = '\0';
    pcVar12[1] = '\0';
    pcVar12[2] = '\0';
    pcVar12[3] = '\0';
    pcVar12[4] = '\0';
    pcVar12[5] = '\0';
    pcVar12[6] = '\0';
    pcVar12[7] = '\0';
    pcVar12 = (char *)((long)nameSuffix + 0x18);
    pcVar12[0] = '\0';
    pcVar12[1] = '\0';
    pcVar12[2] = '\0';
    pcVar12[3] = '\0';
    pcVar12[4] = '\0';
    pcVar12[5] = '\0';
    pcVar12[6] = '\0';
    pcVar12[7] = '\0';
    nameSuffix = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)((long)nameSuffix + 0x38);
    lVar10 = lVar10 + -0x38;
  } while (lVar10 != 0);
  std::__cxx11::string::assign((char *)defaultUniformCollections);
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 1));
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 2));
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 3));
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 4));
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 5));
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 6));
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 7));
  std::__cxx11::string::assign((char *)(defaultUniformCollections + 8));
  pDVar11 = &s_testDataTypes;
  lVar10 = 0;
  do {
    if (lVar10 == 0x1b) {
      pUVar13 = (UniformCollection *)operator_new(0x30);
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (name_1._M_dataplus._M_p._0_4_ = 0; (int)name_1._M_dataplus._M_p < 5;
          name_1._M_dataplus._M_p._0_4_ = (int)name_1._M_dataplus._M_p + 1) {
        DVar1 = (&(anonymous_namespace)::UniformCollection::multipleBasic(char_const*)::types)
                [(int)name_1._M_dataplus._M_p];
        de::toString<int>(&nameWithMatrixType,(int *)&name_1);
        std::operator+(&nameWithBoolType,"_",&nameWithMatrixType);
        std::operator+(&name,&nameWithBoolType,SSBOArrayLengthTests::init::arraysSized + 1);
        pUVar15 = anon_unknown_1::UniformCollection::basic(DVar1,name._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&nameWithBoolType);
        std::__cxx11::string::~string((string *)&nameWithMatrixType);
        anon_unknown_1::UniformCollection::moveContents(pUVar15,pUVar13);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar15);
        operator_delete(pUVar15,0x30);
      }
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,(char *)0x0,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[6].cases,(value_type *)&collectionGroupName);
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
      pUVar13 = (UniformCollection *)operator_new(0x30);
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (name_1._M_dataplus._M_p._0_4_ = 0; (int)name_1._M_dataplus._M_p < 3;
          name_1._M_dataplus._M_p._0_4_ = (int)name_1._M_dataplus._M_p + 1) {
        DVar1 = (&(anonymous_namespace)::UniformCollection::multipleBasicArray(char_const*)::types)
                [(int)name_1._M_dataplus._M_p];
        de::toString<int>(&nameWithMatrixType,(int *)&name_1);
        std::operator+(&nameWithBoolType,"_",&nameWithMatrixType);
        std::operator+(&name,&nameWithBoolType,SSBOArrayLengthTests::init::arraysSized + 1);
        pUVar15 = anon_unknown_1::UniformCollection::basicArray(DVar1,name._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&nameWithBoolType);
        std::__cxx11::string::~string((string *)&nameWithMatrixType);
        anon_unknown_1::UniformCollection::moveContents(pUVar15,pUVar13);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar15);
        operator_delete(pUVar15,0x30);
      }
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,(char *)0x0,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[7].cases,(value_type *)&collectionGroupName);
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
      pUVar13 = (UniformCollection *)operator_new(0x30);
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (pUVar13->m_structTypes).
      super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (pUVar13->m_uniforms).
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (name_1._M_dataplus._M_p._0_4_ = 0; (int)name_1._M_dataplus._M_p < 3;
          name_1._M_dataplus._M_p._0_4_ = (int)name_1._M_dataplus._M_p + 1) {
        DVar1 = (&(anonymous_namespace)::UniformCollection::multipleNestedArraysStructs(char_const*)
                  ::types0)[(int)name_1._M_dataplus._M_p];
        DVar6 = (&(anonymous_namespace)::UniformCollection::multipleNestedArraysStructs(char_const*)
                  ::types1)[(int)name_1._M_dataplus._M_p];
        de::toString<int>(&nameWithMatrixType,(int *)&name_1);
        std::operator+(&nameWithBoolType,"_",&nameWithMatrixType);
        std::operator+(&name,&nameWithBoolType,SSBOArrayLengthTests::init::arraysSized + 1);
        pUVar15 = anon_unknown_1::UniformCollection::nestedArraysStructs
                            (DVar1,DVar6,name._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&name);
        std::__cxx11::string::~string((string *)&nameWithBoolType);
        std::__cxx11::string::~string((string *)&nameWithMatrixType);
        anon_unknown_1::UniformCollection::moveContents(pUVar15,pUVar13);
        anon_unknown_1::UniformCollection::~UniformCollection(pUVar15);
        operator_delete(pUVar15,0x30);
      }
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,(char *)0x0,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[8].cases,(value_type *)&collectionGroupName);
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
      for (checkMethod = CHECKMETHOD_GET_UNIFORM; checkMethod != CHECKMETHOD_LAST;
          checkMethod = checkMethod + CHECKMETHOD_RENDER) {
        pTVar16 = (TestCaseGroup *)operator_new(0x78);
        pcVar12 = (char *)0x0;
        if (checkMethod == CHECKMETHOD_RENDER) {
          pcVar12 = "by_value";
        }
        pcVar14 = (char *)0x0;
        if (checkMethod == CHECKMETHOD_RENDER) {
          pcVar14 = "Assign values by-value";
        }
        if (checkMethod == CHECKMETHOD_GET_UNIFORM) {
          pcVar12 = "by_pointer";
          pcVar14 = "Assign values by-pointer";
        }
        TestCaseGroup::TestCaseGroup(pTVar16,(this->super_TestCaseGroup).m_context,pcVar12,pcVar14);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar16);
        for (uVar23 = 0; uVar23 != 2; uVar23 = uVar23 + 1) {
          pTVar17 = (TestCaseGroup *)operator_new(0x78);
          pcVar12 = (char *)0x0;
          if (uVar23 == 1) {
            pcVar12 = "render";
          }
          pcVar14 = (char *)0x0;
          if (uVar23 == 1) {
            pcVar14 = "Verify values by rendering";
          }
          if (uVar23 == 0) {
            pcVar12 = "get_uniform";
            pcVar14 = "Verify values with glGetUniform*()";
          }
          TestCaseGroup::TestCaseGroup
                    (pTVar17,(this->super_TestCaseGroup).m_context,pcVar12,pcVar14);
          tcu::TestNode::addChild((TestNode *)pTVar16,(TestNode *)pTVar17);
          for (uVar19 = 0; uVar19 != 9; uVar19 = uVar19 + 1) {
            for (iVar5 = 0; iVar5 != (uVar19 == 1 && uVar23 == 0) + 1; iVar5 = iVar5 + 1) {
              pcVar12 = "_first_elem_without_brackets";
              if (iVar5 == 0) {
                pcVar12 = SSBOArrayLengthTests::init::arraysSized + 1;
              }
              std::operator+(&collectionGroupName,&defaultUniformCollections[uVar19].name,pcVar12);
              this_00 = (TestCaseGroup *)0x0;
              for (lVar10 = 0;
                  pUVar25 = defaultUniformCollections[uVar19].cases.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                  lVar10 < (int)(((long)defaultUniformCollections[uVar19].cases.
                                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                        ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar25)
                                / 0x30); lVar10 = lVar10 + 1) {
                pUVar25 = pUVar25 + lVar10;
                std::__cxx11::string::string((string *)&name,(string *)pUVar25);
                bVar3 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                                  ((pUVar25->uniformCollection).m_ptr,glu::isDataTypeBoolOrBVec);
                if (uVar23 == 0) {
                  iVar7 = (uint)(uVar19 < 2 && bVar3) * 2 + 1;
                }
                else {
                  iVar7 = 1;
                }
                bVar4 = anon_unknown_1::UniformCollection::containsMatchingBasicType
                                  ((pUVar25->uniformCollection).m_ptr,glu::isDataTypeMatrix);
                if (checkMethod == CHECKMETHOD_GET_UNIFORM || !bVar4) {
                  for (iVar8 = 0; iVar8 != iVar7; iVar8 = iVar8 + 1) {
                    pcVar12 = "float";
                    if (iVar8 == 2) {
                      pcVar12 = "uint";
                    }
                    uVar21 = (uint)(iVar8 == 2) << 7;
                    if (iVar8 == 1) {
                      uVar21 = 0x40;
                      pcVar12 = "int";
                    }
                    if (uVar23 == 0 && (uVar19 < 2 && bVar3)) {
                      std::operator+(&name_1,&name,"api_");
                      std::operator+(&nameWithMatrixType,&name_1,pcVar12);
                      std::operator+(&nameWithBoolType,&nameWithMatrixType,"_");
                      std::__cxx11::string::~string((string *)&nameWithMatrixType);
                      std::__cxx11::string::~string((string *)&name_1);
                    }
                    else {
                      std::__cxx11::string::string((string *)&nameWithBoolType,(string *)&name);
                    }
                    for (iVar9 = 0; iVar9 != (uVar19 < 2 && bVar4) + 1; iVar9 = iVar9 + 1) {
                      pcVar12 = SSBOArrayLengthTests::init::arraysSized + 1;
                      if (iVar9 == 1) {
                        pcVar12 = "row_major_";
                      }
                      std::operator+(&nameWithMatrixType,&nameWithBoolType,pcVar12);
                      puVar24 = &DAT_00a15c98;
                      for (uVar26 = 0; uVar26 != 3; uVar26 = uVar26 + 1) {
                        std::operator+(&name_1,&nameWithMatrixType,(char *)*puVar24);
                        if (this_00 == (TestCaseGroup *)0x0) {
                          this_00 = (TestCaseGroup *)operator_new(0x78);
                          TestCaseGroup::TestCaseGroup
                                    (this_00,(this->super_TestCaseGroup).m_context,
                                     collectionGroupName._M_dataplus._M_p,
                                     SSBOArrayLengthTests::init::arraysSized + 1);
                          tcu::TestNode::addChild((TestNode *)pTVar17,(TestNode *)this_00);
                        }
                        pUVar18 = (UniformAssignCase *)operator_new(0xf8);
                        UniformAssignCase::UniformAssignCase
                                  (pUVar18,(this->super_TestCaseGroup).m_context,
                                   (char *)CONCAT44(name_1._M_dataplus._M_p._4_4_,
                                                    (int)name_1._M_dataplus._M_p),
                                   (char *)(ulong)uVar26,(CaseShaderType)&pUVar25->uniformCollection
                                   ,(SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                                     *)(ulong)uVar23,checkMethod,
                                   (uVar21 | (uint)(iVar5 != 0) << 8) + (uint)(iVar9 == 1) * 4,
                                   in_stack_fffffffffffffca8);
                        tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pUVar18);
                        std::__cxx11::string::~string((string *)&name_1);
                        puVar24 = puVar24 + 1;
                      }
                      std::__cxx11::string::~string((string *)&nameWithMatrixType);
                    }
                    std::__cxx11::string::~string((string *)&nameWithBoolType);
                  }
                }
                std::__cxx11::string::~string((string *)&name);
              }
              std::__cxx11::string::~string((string *)&collectionGroupName);
            }
          }
        }
      }
      for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
        assignMethod = init::arrayAssignGroups[lVar10].arrayAssignMode;
        pcVar12 = init::arrayAssignGroups[lVar10].name;
        pcVar14 = init::arrayAssignGroups[lVar10].description;
        pTVar16 = (TestCaseGroup *)operator_new(0x78);
        TestCaseGroup::TestCaseGroup(pTVar16,(this->super_TestCaseGroup).m_context,pcVar12,pcVar14);
        tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar16);
        for (lVar20 = 0; lVar20 != 3; lVar20 = lVar20 + 1) {
          iVar5 = init::basicArrayCollectionGroups[lVar20];
          pTVar17 = (TestCaseGroup *)operator_new(0x78);
          TestCaseGroup::TestCaseGroup
                    (pTVar17,(this->super_TestCaseGroup).m_context,
                     defaultUniformCollections[iVar5].name._M_dataplus._M_p,
                     SSBOArrayLengthTests::init::arraysSized + 1);
          tcu::TestNode::addChild((TestNode *)pTVar16,(TestNode *)pTVar17);
          for (lVar22 = 0;
              pUVar25 = defaultUniformCollections[iVar5].cases.
                        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              lVar22 < (int)(((long)defaultUniformCollections[iVar5].cases.
                                    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar25) /
                            0x30); lVar22 = lVar22 + 1) {
            pUVar25 = pUVar25 + lVar22;
            std::__cxx11::string::string((string *)&collectionGroupName,(string *)pUVar25);
            puVar24 = &DAT_00a15c98;
            for (uVar23 = 0; uVar23 != 3; uVar23 = uVar23 + 1) {
              std::operator+(&name,&collectionGroupName,(char *)*puVar24);
              pUVar18 = (UniformAssignCase *)operator_new(0xf8);
              UniformAssignCase::UniformAssignCase
                        (pUVar18,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                         (char *)(ulong)uVar23,(int)pUVar25 + 0x20,
                         (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                          *)0x0,CHECKMETHOD_GET_UNIFORM,assignMethod,in_stack_fffffffffffffca8);
              tcu::TestNode::addChild((TestNode *)pTVar17,(TestNode *)pUVar18);
              std::__cxx11::string::~string((string *)&name);
              puVar24 = puVar24 + 1;
            }
            std::__cxx11::string::~string((string *)&collectionGroupName);
          }
        }
      }
      pTVar16 = (TestCaseGroup *)operator_new(0x78);
      TestCaseGroup::TestCaseGroup
                (pTVar16,(this->super_TestCaseGroup).m_context,"unused_uniforms",
                 "Test with unused uniforms");
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar16);
      for (lVar10 = 0;
          lVar10 < (int)(((long)defaultUniformCollections[4].cases.
                                super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)defaultUniformCollections[4].cases.
                               super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0x30);
          lVar10 = lVar10 + 1) {
        pUVar25 = defaultUniformCollections[4].cases.
                  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
                  ._M_impl.super__Vector_impl_data._M_start + lVar10;
        std::__cxx11::string::string((string *)&collectionGroupName,(string *)pUVar25);
        puVar24 = &DAT_00a15c98;
        for (pcVar12 = (char *)0x0; (int)pcVar12 != 3; pcVar12 = (char *)(ulong)((int)pcVar12 + 1))
        {
          std::operator+(&name,&collectionGroupName,(char *)*puVar24);
          pUVar18 = (UniformAssignCase *)operator_new(0xf8);
          UniformAssignCase::UniformAssignCase
                    (pUVar18,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,pcVar12,
                     (int)pUVar25 + 0x20,
                     (SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::UniformCollection>
                      *)0x0,CHECKMETHOD_GET_UNIFORM,0x21,in_stack_fffffffffffffca8);
          tcu::TestNode::addChild((TestNode *)pTVar16,(TestNode *)pUVar18);
          std::__cxx11::string::~string((string *)&name);
          puVar24 = puVar24 + 1;
        }
        std::__cxx11::string::~string((string *)&collectionGroupName);
      }
      lVar10 = 0x1c0;
      do {
        init::UniformCollectionGroup::~UniformCollectionGroup
                  ((UniformCollectionGroup *)
                   ((long)&defaultUniformCollections[0].name._M_dataplus._M_p + lVar10));
        lVar10 = lVar10 + -0x38;
      } while (lVar10 != -0x38);
      return extraout_EAX;
    }
    DVar1 = *pDVar11;
    pcVar12 = glu::getDataTypeName(DVar1);
    pUVar13 = anon_unknown_1::UniformCollection::basic
                        (DVar1,SSBOArrayLengthTests::init::arraysSized + 1);
    anon_unknown_1::UniformCollectionCase::UniformCollectionCase
              ((UniformCollectionCase *)&collectionGroupName,pcVar12,pUVar13);
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
    ::push_back(&defaultUniformCollections[0].cases,(UniformCollectionCase *)&collectionGroupName);
    anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
              ((UniformCollectionCase *)&collectionGroupName);
    uVar19 = (ulong)DVar1;
    local_350 = (int)lVar10;
    if (DVar1 < TYPE_BOOL_VEC2) {
      if ((0x77003801cU >> (uVar19 & 0x3f) & 1) != 0) goto LAB_004f057c;
      if ((0x888004002U >> (uVar19 & 0x3f) & 1) == 0) goto LAB_004f081f;
LAB_004f05ad:
      pUVar13 = anon_unknown_1::UniformCollection::basicArray
                          (DVar1,SSBOArrayLengthTests::init::arraysSized + 1);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,pcVar12,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[1].cases,(UniformCollectionCase *)&collectionGroupName)
      ;
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
    }
    else {
LAB_004f081f:
      if (DVar1 - TYPE_BOOL_VEC2 < 3) {
LAB_004f057c:
        iVar5 = glu::getDataTypeScalarSize(DVar1);
        if (((iVar5 == 4) || (local_350 == 0xc)) || (local_350 == 0x19)) goto LAB_004f05ad;
      }
      else if ((local_350 == 0x19) || (local_350 == 0xc)) goto LAB_004f05ad;
    }
    if ((DVar1 < TYPE_BOOL_VEC2) && ((0x888004002U >> (uVar19 & 0x3f) & 1) != 0)) {
LAB_004f0605:
      DVar6 = glu::getDataTypeVector(DVar1,4);
LAB_004f0612:
      pcVar14 = glu::getDataTypeName(DVar6);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&nameWithMatrixType,SSBOArrayLengthTests::init::arraysSized + 1,
                 (allocator<char> *)&name_1);
      std::operator+(&nameWithBoolType,&nameWithMatrixType,pcVar12);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &collectionGroupName,&nameWithBoolType,"_");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &collectionGroupName,pcVar14);
      std::__cxx11::string::~string((string *)&collectionGroupName);
      std::__cxx11::string::~string((string *)&nameWithBoolType);
      std::__cxx11::string::~string((string *)&nameWithMatrixType);
      _Var2 = name._M_dataplus;
      pUVar13 = anon_unknown_1::UniformCollection::basicStruct
                          (DVar1,DVar6,false,nameSuffix->_M_local_buf);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,_Var2._M_p,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[2].cases,(UniformCollectionCase *)&collectionGroupName)
      ;
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
      _Var2 = name._M_dataplus;
      pUVar13 = anon_unknown_1::UniformCollection::basicStruct
                          (DVar1,DVar6,true,nameSuffix->_M_local_buf);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,_Var2._M_p,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[4].cases,(UniformCollectionCase *)&collectionGroupName)
      ;
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
      _Var2 = name._M_dataplus;
      pUVar13 = anon_unknown_1::UniformCollection::basicStruct
                          (DVar1,DVar6,false,nameSuffix->_M_local_buf);
      glu::VarType::VarType
                ((VarType *)&nameWithBoolType,
                 &((pUVar13->m_uniforms).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type,3);
      glu::VarType::operator=
                (&((pUVar13->m_uniforms).
                   super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::Uniform,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::Uniform>_>
                   ._M_impl.super__Vector_impl_data._M_start)->type,(VarType *)&nameWithBoolType);
      glu::VarType::~VarType((VarType *)&nameWithBoolType);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,_Var2._M_p,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[3].cases,(UniformCollectionCase *)&collectionGroupName)
      ;
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
      _Var2 = name._M_dataplus;
      pUVar13 = anon_unknown_1::UniformCollection::nestedArraysStructs
                          (DVar1,DVar6,SSBOArrayLengthTests::init::arraysSized + 1);
      anon_unknown_1::UniformCollectionCase::UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName,_Var2._M_p,pUVar13);
      std::
      vector<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::UniformCollectionCase>_>
      ::push_back(&defaultUniformCollections[5].cases,(UniformCollectionCase *)&collectionGroupName)
      ;
      anon_unknown_1::UniformCollectionCase::~UniformCollectionCase
                ((UniformCollectionCase *)&collectionGroupName);
      std::__cxx11::string::~string((string *)&name);
    }
    else if ((local_350 == 0x19) || (local_350 == 0xc)) {
      if ((DVar1 < TYPE_UINT_VEC2) && ((0x88004002U >> (DVar1 & TYPE_UINT) & 1) != 0))
      goto LAB_004f0605;
      nameSuffix = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x29;
      DVar6 = TYPE_LAST;
      if (lVar10 == 0x19) {
        DVar6 = TYPE_SAMPLER_CUBE;
      }
      if (lVar10 == 0xc) {
        DVar6 = TYPE_FLOAT_MAT2;
      }
      goto LAB_004f0612;
    }
    lVar10 = lVar10 + 1;
    pDVar11 = pDVar11 + 1;
  } while( true );
}

Assistant:

void ProgramUniformTests::init (void)
{
	// Generate sets of UniformCollections that are used by several cases.

	enum
	{
		UNIFORMCOLLECTIONS_BASIC = 0,
		UNIFORMCOLLECTIONS_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_BASIC_STRUCT,
		UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY,
		UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT,
		UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC,
		UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY,
		UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS,

		UNIFORMCOLLECTIONS_LAST
	};

	struct UniformCollectionGroup
	{
		string							name;
		vector<UniformCollectionCase>	cases;
	} defaultUniformCollections[UNIFORMCOLLECTIONS_LAST];

	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].name							= "basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].name						= "basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].name						= "basic_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].name					= "struct_in_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].name					= "array_in_struct";
	defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].name			= "nested_structs_arrays";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].name					= "multiple_basic";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].name				= "multiple_basic_array";
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].name	= "multiple_nested_structs_arrays";

	for (int dataTypeNdx = 0; dataTypeNdx < DE_LENGTH_OF_ARRAY(s_testDataTypes); dataTypeNdx++)
	{
		const glu::DataType		dataType	= s_testDataTypes[dataTypeNdx];
		const char* const		typeName	= glu::getDataTypeName(dataType);

		defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basic(dataType)));

		if (glu::isDataTypeScalar(dataType)													||
			(glu::isDataTypeVector(dataType) && glu::getDataTypeScalarSize(dataType) == 4)	||
			dataType == glu::TYPE_FLOAT_MAT4												||
			dataType == glu::TYPE_SAMPLER_2D)
			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_ARRAY].cases.push_back(UniformCollectionCase(typeName, UniformCollection::basicArray(dataType)));

		if (glu::isDataTypeScalar(dataType)		||
			dataType == glu::TYPE_FLOAT_MAT4	||
			dataType == glu::TYPE_SAMPLER_2D)
		{
			const glu::DataType		secondDataType	= glu::isDataTypeScalar(dataType)	? glu::getDataTypeVector(dataType, 4)
													: dataType == glu::TYPE_FLOAT_MAT4	? glu::TYPE_FLOAT_MAT2
													: dataType == glu::TYPE_SAMPLER_2D	? glu::TYPE_SAMPLER_CUBE
													: glu::TYPE_LAST;
			DE_ASSERT(secondDataType != glu::TYPE_LAST);
			const char* const		secondTypeName	= glu::getDataTypeName(secondDataType);
			const string			name			= string("") + typeName + "_" + secondTypeName;

			defaultUniformCollections[UNIFORMCOLLECTIONS_BASIC_STRUCT].cases.push_back			(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::basicStruct(dataType, secondDataType, true)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_STRUCT_IN_ARRAY].cases.push_back		(UniformCollectionCase(name.c_str(), UniformCollection::structInArray(dataType, secondDataType, false)));
			defaultUniformCollections[UNIFORMCOLLECTIONS_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(name.c_str(), UniformCollection::nestedArraysStructs(dataType, secondDataType)));
		}
	}
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC].cases.push_back					(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasic()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY].cases.push_back				(UniformCollectionCase(DE_NULL, UniformCollection::multipleBasicArray()));
	defaultUniformCollections[UNIFORMCOLLECTIONS_MULTIPLE_NESTED_STRUCTS_ARRAYS].cases.push_back	(UniformCollectionCase(DE_NULL, UniformCollection::multipleNestedArraysStructs()));

	// Basic by-pointer or by-value uniform assignment cases.

	for (int assignMethodI = 0; assignMethodI < (int)UniformAssignCase::ASSIGNMETHOD_LAST; assignMethodI++)
	{
		const UniformAssignCase::AssignMethod	assignMethod		= (UniformAssignCase::AssignMethod)assignMethodI;
		TestCaseGroup* const					assignMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getAssignMethodName(assignMethod), UniformAssignCase::getAssignMethodDescription(assignMethod));
		addChild(assignMethodGroup);

		for (int checkMethodI = 0; checkMethodI < (int)UniformAssignCase::CHECKMETHOD_LAST; checkMethodI++)
		{
			const UniformAssignCase::CheckMethod	checkMethod			= (UniformAssignCase::CheckMethod)checkMethodI;
			TestCaseGroup* const					checkMethodGroup	= new TestCaseGroup(m_context, UniformAssignCase::getCheckMethodName(checkMethod), UniformAssignCase::getCheckMethodDescription(checkMethod));
			assignMethodGroup->addChild(checkMethodGroup);

			for (int collectionGroupNdx = 0; collectionGroupNdx < (int)UNIFORMCOLLECTIONS_LAST; collectionGroupNdx++)
			{
				const int numArrayFirstElemNameCases = checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY ? 2 : 1;

				for (int referToFirstArrayElemWithoutIndexI = 0; referToFirstArrayElemWithoutIndexI < numArrayFirstElemNameCases; referToFirstArrayElemWithoutIndexI++)
				{
					const UniformCollectionGroup&	collectionGroup			= defaultUniformCollections[collectionGroupNdx];
					const string					collectionGroupName		= collectionGroup.name + (referToFirstArrayElemWithoutIndexI == 0 ? "" : "_first_elem_without_brackets");
					TestCaseGroup*					collectionTestGroup		= DE_NULL;

					for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
					{
						const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
						const string								collName			= collectionCase.namePrefix;
						const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;
						const bool									containsBooleans	= uniformCollection->containsMatchingBasicType(glu::isDataTypeBoolOrBVec);
						const bool									varyBoolApiType		= checkMethod == UniformAssignCase::CHECKMETHOD_GET_UNIFORM && containsBooleans &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numBoolVariations	= varyBoolApiType ? 3 : 1;
						const bool									containsMatrices	= uniformCollection->containsMatchingBasicType(glu::isDataTypeMatrix);
						const bool									varyMatrixMode		= containsMatrices &&
																							(collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC || collectionGroupNdx == UNIFORMCOLLECTIONS_BASIC_ARRAY);
						const int									numMatVariations	= varyMatrixMode ? 2 : 1;

						if (containsMatrices && assignMethod != UniformAssignCase::ASSIGNMETHOD_POINTER)
							continue;

						for (int booleanTypeI = 0; booleanTypeI < numBoolVariations; booleanTypeI++)
						{
							const deUint32		booleanTypeFeat		= booleanTypeI == 1 ? UniformCase::FEATURE_BOOLEANAPITYPE_INT
																	: booleanTypeI == 2 ? UniformCase::FEATURE_BOOLEANAPITYPE_UINT
																	: 0;
							const char* const	booleanTypeName		= booleanTypeI == 1 ? "int"
																	: booleanTypeI == 2 ? "uint"
																	: "float";
							const string		nameWithBoolType	= varyBoolApiType ? collName + "api_" + booleanTypeName + "_" : collName;

							for (int matrixTypeI = 0; matrixTypeI < numMatVariations; matrixTypeI++)
							{
								const string nameWithMatrixType = nameWithBoolType + (matrixTypeI == 1 ? "row_major_" : "");

								for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
								{
									const string	name							= nameWithMatrixType + getCaseShaderTypeName((CaseShaderType)shaderType);
									const deUint32	arrayFirstElemNameNoIndexFeat	= referToFirstArrayElemWithoutIndexI == 0 ? 0 : UniformCase::FEATURE_ARRAY_FIRST_ELEM_NAME_NO_INDEX;

									// skip empty groups by creating groups on demand
									if (!collectionTestGroup)
									{
										collectionTestGroup = new TestCaseGroup(m_context, collectionGroupName.c_str(), "");
										checkMethodGroup->addChild(collectionTestGroup);
									}

									collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																						checkMethod, assignMethod,
																						booleanTypeFeat | arrayFirstElemNameNoIndexFeat | (matrixTypeI == 1 ? UniformCase::FEATURE_MATRIXMODE_ROWMAJOR : 0)));
								}
							}
						}
					}
				}
			}
		}
	}

	// Cases that assign multiple basic-array elements with one glProgramUniform*v() (i.e. the count parameter is bigger than 1).

	{
		static const struct
		{
			UniformCase::Feature	arrayAssignMode;
			const char*				name;
			const char*				description;
		} arrayAssignGroups[] =
		{
			{ UniformCase::FEATURE_ARRAYASSIGN_FULL,			"basic_array_assign_full",		"Assign entire basic-type arrays per glProgramUniform*v() call"				},
			{ UniformCase::FEATURE_ARRAYASSIGN_BLOCKS_OF_TWO,	"basic_array_assign_partial",	"Assign two elements of a basic-type array per glProgramUniform*v() call"	}
		};

		for (int arrayAssignGroupNdx = 0; arrayAssignGroupNdx < DE_LENGTH_OF_ARRAY(arrayAssignGroups); arrayAssignGroupNdx++)
		{
			UniformCase::Feature	arrayAssignMode		= arrayAssignGroups[arrayAssignGroupNdx].arrayAssignMode;
			const char* const		groupName			= arrayAssignGroups[arrayAssignGroupNdx].name;
			const char* const		groupDesc			= arrayAssignGroups[arrayAssignGroupNdx].description;

			TestCaseGroup* const curArrayAssignGroup = new TestCaseGroup(m_context, groupName, groupDesc);
			addChild(curArrayAssignGroup);

			static const int basicArrayCollectionGroups[] = { UNIFORMCOLLECTIONS_BASIC_ARRAY, UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT, UNIFORMCOLLECTIONS_MULTIPLE_BASIC_ARRAY };

			for (int collectionGroupNdx = 0; collectionGroupNdx < DE_LENGTH_OF_ARRAY(basicArrayCollectionGroups); collectionGroupNdx++)
			{
				const UniformCollectionGroup&	collectionGroup		= defaultUniformCollections[basicArrayCollectionGroups[collectionGroupNdx]];
				TestCaseGroup* const			collectionTestGroup	= new TestCaseGroup(m_context, collectionGroup.name.c_str(), "");
				curArrayAssignGroup->addChild(collectionTestGroup);

				for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
				{
					const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
					const string								collName			= collectionCase.namePrefix;
					const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

					for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
					{
						const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
						collectionTestGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																			UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																			arrayAssignMode));
					}
				}
			}
		}
	}

	// Cases with unused uniforms.

	{
		TestCaseGroup* const unusedUniformsGroup = new TestCaseGroup(m_context, "unused_uniforms", "Test with unused uniforms");
		addChild(unusedUniformsGroup);

		const UniformCollectionGroup& collectionGroup = defaultUniformCollections[UNIFORMCOLLECTIONS_ARRAY_IN_STRUCT];

		for (int collectionNdx = 0; collectionNdx < (int)collectionGroup.cases.size(); collectionNdx++)
		{
			const UniformCollectionCase&				collectionCase		= collectionGroup.cases[collectionNdx];
			const string								collName			= collectionCase.namePrefix;
			const SharedPtr<const UniformCollection>&	uniformCollection	= collectionCase.uniformCollection;

			for (int shaderType = 0; shaderType < (int)CASESHADERTYPE_LAST; shaderType++)
			{
				const string name = collName + getCaseShaderTypeName((CaseShaderType)shaderType);
				unusedUniformsGroup->addChild(new UniformAssignCase(m_context, name.c_str(), "", (CaseShaderType)shaderType, uniformCollection,
																	UniformAssignCase::CHECKMETHOD_GET_UNIFORM, UniformAssignCase::ASSIGNMETHOD_POINTER,
																	UniformCase::FEATURE_ARRAYUSAGE_ONLY_MIDDLE_INDEX | UniformCase::FEATURE_UNIFORMUSAGE_EVERY_OTHER));
			}
		}
	}
}